

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_mat * rf_mat_look_at(rf_mat *__return_storage_ptr__,rf_vec3 eye,rf_vec3 target,rf_vec3 up)

{
  rf_vec3 rVar1;
  rf_vec3 rVar2;
  rf_vec3 rVar3;
  undefined1 in_stack_00000020 [64];
  float local_98;
  float fStack_94;
  float local_88;
  
  rVar1.x = eye.x - target.x;
  rVar1.y = eye.y - target.y;
  rVar1.z = eye.z - target.z;
  rVar1 = rf_vec3_normalize(rVar1);
  rVar2 = rf_vec3_cross_product(up,rVar1);
  rVar2 = rf_vec3_normalize(rVar2);
  rVar3 = rf_vec3_cross_product(rVar1,rVar2);
  rVar3 = rf_vec3_normalize(rVar3);
  local_98 = rVar2.x;
  fStack_94 = rVar2.y;
  local_88 = rVar1.x;
  __return_storage_ptr__->m0 = local_98;
  __return_storage_ptr__->m4 = rVar3.x;
  __return_storage_ptr__->m8 = local_88;
  __return_storage_ptr__->m12 = eye.x;
  __return_storage_ptr__->m2 = rVar2.z;
  __return_storage_ptr__->m1 = fStack_94;
  __return_storage_ptr__->m5 = rVar3.y;
  __return_storage_ptr__->m6 = rVar3.z;
  __return_storage_ptr__->m9 = rVar1.y;
  __return_storage_ptr__->m10 = rVar1.z;
  __return_storage_ptr__->m13 = eye.y;
  __return_storage_ptr__->m14 = eye.z;
  __return_storage_ptr__->m3 = 0.0;
  __return_storage_ptr__->m7 = 0.0;
  __return_storage_ptr__->m11 = 0.0;
  __return_storage_ptr__->m15 = 1.0;
  rf_mat_invert((rf_mat)in_stack_00000020);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mat rf_mat_look_at(rf_vec3 eye, rf_vec3 target, rf_vec3 up)
{
    rf_mat result = {0};

    rf_vec3 z = rf_vec3_sub(eye, target);
    z = rf_vec3_normalize(z);
    rf_vec3 x = rf_vec3_cross_product(up, z);
    x = rf_vec3_normalize(x);
    rf_vec3 y = rf_vec3_cross_product(z, x);
    y = rf_vec3_normalize(y);

    result.m0 = x.x;
    result.m1 = x.y;
    result.m2 = x.z;
    result.m3 = 0.0f;
    result.m4 = y.x;
    result.m5 = y.y;
    result.m6 = y.z;
    result.m7 = 0.0f;
    result.m8 = z.x;
    result.m9 = z.y;
    result.m10 = z.z;
    result.m11 = 0.0f;
    result.m12 = eye.x;
    result.m13 = eye.y;
    result.m14 = eye.z;
    result.m15 = 1.0f;

    result = rf_mat_invert(result);

    return result;
}